

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYRef<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYRef<float>,_ImPlot::GetterXsYRef<float>,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYRef<float> *pGVar8;
  GetterXsYRef<float> *pGVar9;
  ImDrawVert *pIVar10;
  ImDrawIdx *pIVar11;
  undefined1 auVar12 [16];
  ulong uVar13;
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  int iVar17;
  ImDrawIdx IVar18;
  ImPlotContext *gp;
  float fVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  float fVar23;
  double dVar24;
  ulong uVar25;
  float fVar26;
  float fVar27;
  float fVar33;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  pGVar8 = this->Getter1;
  pGVar9 = this->Getter2;
  iVar17 = pGVar8->Count;
  iVar4 = this->Transformer->YAxis;
  iVar5 = pGVar9->Count;
  IVar1 = GImPlot->PixelRange[iVar4].Min;
  dVar22 = (double)IVar1.x;
  dVar24 = (double)IVar1.y;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar4].Range.Min;
  dVar3 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar19 = (float)((pGVar8->YRef - dVar2) * GImPlot->My[iVar4] + dVar24);
  fVar20 = (float)(((double)*(float *)((long)pGVar8->Xs +
                                      (long)(((pGVar8->Offset + prim) % iVar17 + iVar17) % iVar17) *
                                      (long)pGVar8->Stride) - dVar3) * GImPlot->Mx + dVar22);
  fVar21 = (float)((pGVar9->YRef - dVar2) * GImPlot->My[iVar4] + dVar24);
  fVar23 = (float)(((double)*(float *)((long)pGVar9->Xs +
                                      (long)(((prim + pGVar9->Offset) % iVar5 + iVar5) % iVar5) *
                                      (long)pGVar9->Stride) - dVar3) * GImPlot->Mx + dVar22);
  uVar25 = CONCAT44(-(uint)(fVar23 <= fVar20),-(uint)(fVar21 <= fVar19));
  auVar14._4_8_ = dVar3;
  auVar14._0_4_ = fVar20;
  auVar28._0_8_ = auVar14._0_8_ << 0x20;
  auVar28._8_4_ = fVar19;
  auVar28._12_4_ = fVar20;
  auVar15._4_8_ = auVar28._8_8_;
  auVar15._0_4_ = -(uint)(fVar20 < fVar23);
  auVar29._0_8_ = auVar15._0_8_ << 0x20;
  auVar29._8_4_ = -(uint)(fVar19 < fVar21);
  auVar29._12_4_ = -(uint)(fVar20 < fVar23);
  uVar13 = CONCAT44(fVar20,fVar19) & auVar29._8_8_;
  auVar30._0_8_ = ~uVar25 & CONCAT44(fVar23,fVar21);
  auVar30._8_8_ = ~auVar29._8_8_ & CONCAT44(fVar23,fVar21);
  auVar12._8_4_ = (int)uVar13;
  auVar12._0_8_ = CONCAT44(fVar20,fVar19) & uVar25;
  auVar12._12_4_ = (int)(uVar13 >> 0x20);
  auVar30 = auVar30 | auVar12;
  fVar33 = (cull_rect->Min).x;
  auVar32._4_4_ = -(uint)(fVar33 < auVar30._4_4_);
  auVar32._0_4_ = -(uint)((cull_rect->Min).y < auVar30._0_4_);
  auVar16._4_8_ = auVar30._8_8_;
  auVar16._0_4_ = -(uint)(auVar30._4_4_ < fVar33);
  auVar31._0_8_ = auVar16._0_8_ << 0x20;
  auVar31._8_4_ = -(uint)(auVar30._8_4_ < (cull_rect->Max).y);
  auVar31._12_4_ = -(uint)(auVar30._12_4_ < (cull_rect->Max).x);
  auVar32._8_8_ = auVar31._8_8_;
  iVar17 = movmskps(iVar4 * 0x10,auVar32);
  if (iVar17 == 0xf) {
    IVar6 = this->Col;
    IVar1 = *uv;
    fVar26 = fVar21 - fVar19;
    fVar33 = fVar23 - fVar20;
    fVar27 = fVar33 * fVar33 + fVar26 * fVar26;
    if (0.0 < fVar27) {
      fVar27 = 1.0 / SQRT(fVar27);
      fVar33 = fVar33 * fVar27;
      fVar26 = fVar26 * fVar27;
    }
    fVar27 = this->Weight * 0.5;
    pIVar10 = DrawList->_VtxWritePtr;
    fVar33 = fVar27 * fVar33;
    fVar27 = fVar27 * fVar26;
    (pIVar10->pos).x = fVar27 + fVar20;
    (pIVar10->pos).y = fVar19 - fVar33;
    (pIVar10->uv).x = IVar1.x;
    (pIVar10->uv).y = IVar1.y;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar6;
    pIVar10[1].pos.x = fVar27 + fVar23;
    pIVar10[1].pos.y = fVar21 - fVar33;
    pIVar10[1].uv = IVar1;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar6;
    pIVar10[2].pos.x = fVar23 - fVar27;
    pIVar10[2].pos.y = fVar33 + fVar21;
    pIVar10[2].uv = IVar1;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar6;
    pIVar10[3].pos.x = fVar20 - fVar27;
    pIVar10[3].pos.y = fVar33 + fVar19;
    pIVar10[3].uv = IVar1;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar11 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar7;
    *pIVar11 = IVar18;
    pIVar11[1] = IVar18 + 1;
    pIVar11[2] = IVar18 + 2;
    pIVar11[3] = IVar18;
    pIVar11[4] = IVar18 + 2;
    pIVar11[5] = IVar18 + 3;
    DrawList->_IdxWritePtr = pIVar11 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return (char)iVar17 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }